

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar4;
  _Alloc_hider _Var5;
  pointer pbVar6;
  bool bVar7;
  TargetType targetType;
  int iVar8;
  cmGlobalNinjaGenerator *pcVar9;
  string *psVar10;
  cmValue cVar11;
  undefined4 extraout_var;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  char *pcVar12;
  cmOutputConverter *outputConverter;
  string *linkCmd;
  pointer s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string responseFlag;
  string launcher;
  cmNinjaRule rule;
  string local_410;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f0;
  string local_3d8;
  long *local_3a8;
  long local_3a0;
  long local_398 [2];
  string local_388;
  undefined8 local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_360;
  size_t local_358;
  char *local_350;
  undefined8 local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  string local_318;
  string local_2f8;
  string local_2d8;
  undefined1 local_2a8 [32];
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  char *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  char *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  bool local_188;
  RuleVariables local_180;
  cmRulePlaceholderExpander *this_01;
  
  LanguageLinkerDeviceRule(&local_2f8,this,config);
  local_2a8._0_8_ = local_2a8 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p == &local_2f8.field_2) {
    local_2a8._24_8_ = local_2f8.field_2._8_8_;
  }
  else {
    local_2a8._0_8_ = local_2f8._M_dataplus._M_p;
  }
  local_288._M_p = (pointer)&local_278;
  local_2a8._8_8_ = local_2f8._M_string_length;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  local_280 = 0;
  local_278._M_local_buf[0] = '\0';
  local_268._M_p = (pointer)&local_258;
  local_260 = 0;
  local_258._M_local_buf[0] = '\0';
  local_248._M_p = (pointer)&local_238;
  local_240 = 0;
  local_238._M_local_buf[0] = '\0';
  local_228._M_p = (pointer)&local_218;
  local_220 = 0;
  local_218._M_local_buf[0] = '\0';
  local_208._M_p = (pointer)&local_1f8;
  local_200 = 0;
  local_1f8._M_local_buf[0] = '\0';
  local_1e8._M_p = (pointer)&local_1d8;
  local_1e0 = (char *)0x0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = (char *)0x0;
  local_1b8._M_local_buf[0] = '\0';
  local_1a8._M_p = (pointer)&local_198;
  local_1a0 = (char *)0x0;
  local_198._M_local_buf[0] = '\0';
  local_188 = false;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  pcVar9 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar7 = cmGlobalNinjaGenerator::HasRule(pcVar9,(string *)local_2a8);
  if (!bVar7) {
    memset(&local_180,0,0x150);
    psVar10 = cmGeneratorTarget::GetName_abi_cxx11_
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget);
    local_180.CMTargetName = (psVar10->_M_dataplus)._M_p;
    targetType = cmGeneratorTarget::GetType
                           ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                            GeneratorTarget);
    psVar10 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    local_180.CMTargetType = (psVar10->_M_dataplus)._M_p;
    local_180.Language = "CUDA";
    this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    paVar1 = &local_388.field_2;
    local_388._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_388,"CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG","");
    psVar10 = cmMakefile::GetSafeDefinition(this_00,&local_388);
    local_3a8 = local_398;
    pcVar3 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a8,pcVar3,pcVar3 + psVar10->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar1) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    local_180.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    local_180.Objects = "$in";
    if ((useResponseFile) && (local_3a0 != 0)) {
      std::__cxx11::string::_M_replace((ulong)&local_1e8,0,local_1e0,0x694b61);
      std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_1e8._M_p);
      pcVar9 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar12 = "$in_newline";
      if (pcVar9->UsingGCCOnWindows != false) {
        pcVar12 = "$in";
      }
      std::__cxx11::string::_M_replace((ulong)&local_1c8,0,local_1c0,(ulong)pcVar12);
      std::__cxx11::string::append((char *)&local_1c8);
      local_180.LinkLibraries = "";
      local_180.Objects = (char *)local_3a8;
    }
    local_180.ObjectDir = "$OBJECT_DIR";
    local_180.Target = "$TARGET_FILE";
    local_180.SONameFlag = "$SONAME_FLAG";
    local_180.TargetSOName = "$SONAME";
    local_180.TargetPDB = "$TARGET_PDB";
    local_180.TargetCompilePDB = "$TARGET_COMPILE_PDB";
    local_180.Flags = "$FLAGS";
    local_180.LinkFlags = "$LINK_FLAGS";
    local_180.Manifests = "$MANIFESTS";
    local_180.LanguageCompileFlags = "$LANGUAGE_COMPILE_FLAGS";
    local_338 = &local_328;
    local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_328._M_local_buf[0] = '\0';
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar4 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    local_388._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"RULE_LAUNCH_LINK","");
    cVar11 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar4,target,&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar1) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((cVar11.Value != (string *)0x0) &&
       ((pointer)(cVar11.Value)->_M_string_length != (pointer)0x0)) {
      local_3d8._M_string_length = (size_type)((cVar11.Value)->_M_dataplus)._M_p;
      local_388._M_dataplus._M_p = (pointer)0x1;
      local_388.field_2._M_local_buf[0] = 0x20;
      local_3d8.field_2._M_allocated_capacity = 1;
      views._M_len = 2;
      views._M_array = (iterator)&local_3d8;
      local_3d8._M_dataplus._M_p = (pointer)(cVar11.Value)->_M_string_length;
      local_3d8.field_2._8_8_ = paVar1;
      local_388._M_string_length = (size_type)paVar1;
      cmCatViews_abi_cxx11_(&local_2d8,views);
      std::__cxx11::string::operator=((string *)&local_338,(string *)&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,
                        CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                                 local_2d8.field_2._M_local_buf[0]) + 1);
      }
    }
    iVar8 = (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
              super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
    this_01 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar8);
    ComputeDeviceLinkCmd_abi_cxx11_(&local_3f0,this);
    pbVar6 = local_3f0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_3f0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_3f0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      s = local_3f0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_388.field_2._8_8_ = (s->_M_dataplus)._M_p;
        local_388.field_2._M_allocated_capacity = s->_M_string_length;
        local_388._M_dataplus._M_p = (pointer)local_330;
        local_388._M_string_length = (size_type)local_338;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&local_388;
        cmCatViews_abi_cxx11_(&local_3d8,views_00);
        std::__cxx11::string::operator=((string *)s,(string *)&local_3d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
        }
        pcVar4 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
        outputConverter =
             &(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
        if (pcVar4 == (cmLocalNinjaGenerator *)0x0) {
          outputConverter = (cmOutputConverter *)0x0;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables(this_01,outputConverter,s,&local_180);
        s = s + 1;
      } while (s != pbVar6);
    }
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<cmNinjaRemoveNoOpCommands>>
                        (local_3f0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_3f0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_3f0,(iterator)__first._M_current,
               (iterator)
               local_3f0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    paVar1 = &local_3d8.field_2;
    local_3d8._M_string_length = 0;
    local_3d8.field_2._M_allocated_capacity =
         local_3d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_3d8._M_dataplus._M_p = (pointer)paVar1;
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_388,(this->super_cmNinjaTargetGenerator).LocalGenerator,&local_3f0,config,
               config,&local_3d8,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&local_288,(string *)&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    cmGeneratorTarget::GetLinkerLanguage
              (&local_318,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    _Var5._M_p = local_318._M_dataplus._M_p;
    pcVar12 = GetVisibleTypeName(this);
    local_388._M_dataplus._M_p = &DAT_00000011;
    local_388._M_string_length = 0x69530d;
    local_388.field_2._M_allocated_capacity = local_318._M_string_length;
    local_388.field_2._8_8_ = _Var5._M_p;
    local_3d8._M_dataplus._M_p = (pointer)0x1;
    local_3d8.field_2._M_local_buf[0] = 0x20;
    local_368 = 1;
    local_3d8._M_string_length = (size_type)paVar1;
    local_360 = paVar1;
    local_358 = strlen(pcVar12);
    paVar2 = &local_2d8.field_2;
    local_2d8._M_dataplus._M_p = (pointer)0x1;
    local_2d8.field_2._M_local_buf[0] = '.';
    local_348 = 1;
    views_01._M_len = 5;
    views_01._M_array = (iterator)&local_388;
    local_350 = pcVar12;
    local_340 = paVar2;
    local_2d8._M_string_length = (size_type)paVar2;
    cmCatViews_abi_cxx11_(&local_410,views_01);
    std::__cxx11::string::operator=((string *)&local_248,(string *)&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    cmGeneratorTarget::GetLinkerLanguage
              (&local_410,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    _Var5._M_p = local_410._M_dataplus._M_p;
    pcVar12 = GetVisibleTypeName(this);
    local_388._M_dataplus._M_p = (pointer)0x8;
    local_388._M_string_length = 0x69531f;
    local_388.field_2._M_allocated_capacity = local_410._M_string_length;
    local_388.field_2._8_8_ = _Var5._M_p;
    local_3d8._M_dataplus._M_p = (pointer)0x1;
    local_3d8.field_2._M_local_buf[0] = 0x20;
    local_368 = 1;
    local_3d8._M_string_length = (size_type)paVar1;
    local_360 = paVar1;
    local_358 = strlen(pcVar12);
    local_348 = 0xd;
    local_340 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x695724;
    views_02._M_len = 5;
    views_02._M_array = (iterator)&local_388;
    local_350 = pcVar12;
    cmCatViews_abi_cxx11_(&local_2d8,views_02);
    std::__cxx11::string::operator=((string *)&local_268,(string *)&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2d8._M_dataplus._M_p,
                      CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                               local_2d8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&local_1a8,0,local_1a0,0x695328);
    pcVar9 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar9,(cmNinjaRule *)local_2a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3f0);
    if (this_01 != (cmRulePlaceholderExpander *)0x0) {
      (*(this_01->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])(this_01);
    }
    if (local_338 != &local_328) {
      operator_delete(local_338,
                      CONCAT71(local_328._M_allocated_capacity._1_7_,local_328._M_local_buf[0]) + 1)
      ;
    }
    if (local_3a8 != local_398) {
      operator_delete(local_3a8,local_398[0] + 1);
    }
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_2a8);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkRule(
  bool useResponseFile, const std::string& config)
{
  cmNinjaRule rule(this->LanguageLinkerDeviceRule(config));
  if (!this->GetGlobalGenerator()->HasRule(rule.Name)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
        .c_str();

    vars.Language = "CUDA";

    // build response file name
    std::string responseFlag = this->GetMakefile()->GetSafeDefinition(
      "CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG");

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }
      rule.RspContent += " $LINK_LIBRARIES";
      vars.Objects = responseFlag.c_str();
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetPDB = "$TARGET_PDB";
    vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    vars.LanguageCompileFlags = "$LANGUAGE_COMPILE_FLAGS";

    std::string launcher;
    cmValue val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (cmNonempty(val)) {
      launcher = cmStrCat(*val, ' ');
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeDeviceLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = cmStrCat(launcher, linkCmd);
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cm::erase_if(linkCmds, cmNinjaRemoveNoOpCommands());

    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds, config, config);

    // Write the linker rule with response file if needed.
    rule.Comment =
      cmStrCat("Rule for linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), '.');
    rule.Description =
      cmStrCat("Linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), " $TARGET_FILE");
    rule.Restat = "$RESTAT";

    this->GetGlobalGenerator()->AddRule(rule);
  }
}